

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

list_iterator<int> * __thiscall
nestl::impl::list_iterator<int>::operator++(list_iterator<int> *this)

{
  list_node_base *plVar1;
  list_node_base *plVar2;
  list_node_base *plVar3;
  char *pcVar4;
  
  plVar1 = this->m_node;
  if (plVar1 == (list_node_base *)0x0) {
    pcVar4 = "m_node";
  }
  else if (plVar1->m_prev == (list_node_base *)0x0) {
    pcVar4 = "(m_node)->m_prev";
  }
  else {
    plVar2 = plVar1->m_next;
    if (plVar2 == (list_node_base *)0x0) {
      pcVar4 = "(m_node)->m_next";
    }
    else if (plVar1->m_prev->m_next == plVar1) {
      plVar3 = plVar2->m_prev;
      if (plVar3 == plVar1) {
        this->m_node = plVar2;
        if (plVar3 == (list_node_base *)0x0) {
          pcVar4 = "(m_node)->m_prev";
        }
        else if (plVar2->m_next == (list_node_base *)0x0) {
          pcVar4 = "(m_node)->m_next";
        }
        else if (plVar3->m_next == plVar2) {
          if (plVar2->m_next->m_prev == plVar2) {
            return this;
          }
          pcVar4 = "(m_node)->m_next->m_prev == (m_node)";
        }
        else {
          pcVar4 = "(m_node)->m_prev->m_next == (m_node)";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                      ,0xf2,
                      "list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]");
      }
      pcVar4 = "(m_node)->m_next->m_prev == (m_node)";
    }
    else {
      pcVar4 = "(m_node)->m_prev->m_next == (m_node)";
    }
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]");
}

Assistant:

list_iterator& operator++() NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        m_node = m_node->m_next;
        NESTL_CHECK_LIST_NODE(m_node);

        return *this;
    }